

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_ManVerifyTopoOrder(Aig_Man_t *p)

{
  Tim_Man_t *pTVar1;
  int iVar2;
  uint iBox_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  int nTerms;
  int iTerm1;
  int iBox;
  int k;
  int i;
  Aig_Obj_t *pNext;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  iBox = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= iBox) {
      Aig_ManCleanCioIds(p);
      return 1;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iBox);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar2 = Aig_ObjIsNode(pObj_00);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsCo(pObj_00);
        if ((iVar2 == 0) && (iVar2 = Aig_ObjIsBuf(pObj_00), iVar2 == 0)) {
          iVar2 = Aig_ObjIsCi(pObj_00);
          if (iVar2 == 0) {
            iVar2 = Aig_ObjIsConst1(pObj_00);
            if (iVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                            ,0x65,"int Aig_ManVerifyTopoOrder(Aig_Man_t *)");
            }
          }
          else if (p->pManTime != (void *)0x0) {
            pTVar1 = (Tim_Man_t *)p->pManTime;
            iVar2 = Aig_ObjCioId(pObj_00);
            iBox_00 = Tim_ManBoxForCi(pTVar1,iVar2);
            if (-1 < (int)iBox_00) {
              iVar2 = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,iBox_00);
              iVar3 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,iBox_00);
              for (iTerm1 = 0; iTerm1 < iVar3; iTerm1 = iTerm1 + 1) {
                pAVar6 = Aig_ManCo(p,iVar2 + iTerm1);
                pTVar1 = (Tim_Man_t *)p->pManTime;
                iVar4 = Aig_ObjCioId(pAVar6);
                uVar5 = Tim_ManBoxForCo(pTVar1,iVar4);
                if (uVar5 != iBox_00) {
                  __assert_fail("Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                                ,0x5a,"int Aig_ManVerifyTopoOrder(Aig_Man_t *)");
                }
                iVar4 = Aig_ObjIsTravIdCurrent(p,pAVar6);
                if (iVar4 == 0) {
                  printf("Box %d has input %d that is not in a topological order.\n",(ulong)iBox_00,
                         (ulong)(uint)pAVar6->Id);
                  return 0;
                }
              }
            }
          }
        }
        else {
          pAVar6 = Aig_ObjFanin0(pObj_00);
          iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar6);
          if (iVar2 == 0) {
            printf("Node %d has fanin %d that is not in a topological order.\n",
                   (ulong)(uint)pObj_00->Id,(ulong)(uint)pAVar6->Id);
            return 0;
          }
        }
      }
      else {
        pAVar6 = Aig_ObjFanin0(pObj_00);
        iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar6);
        if (iVar2 == 0) {
          printf("Node %d has fanin %d that is not in a topological order.\n",
                 (ulong)(uint)pObj_00->Id,(ulong)(uint)pAVar6->Id);
          return 0;
        }
        pAVar6 = Aig_ObjFanin1(pObj_00);
        iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar6);
        if (iVar2 == 0) {
          printf("Node %d has fanin %d that is not in a topological order.\n",
                 (ulong)(uint)pObj_00->Id,(ulong)(uint)pAVar6->Id);
          return 0;
        }
      }
      Aig_ObjSetTravIdCurrent(p,pObj_00);
    }
    iBox = iBox + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManVerifyTopoOrder( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCo(pObj) || Aig_ObjIsBuf(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
            {
                iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Aig_ManCo( p, iTerm1 + k );
                        assert( Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox ); 
                        if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else if ( !Aig_ObjIsConst1(pObj) )
            assert( 0 );
        Aig_ObjSetTravIdCurrent( p, pObj );
    }
    Aig_ManCleanCioIds( p );
    return 1;
}